

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cover_graph.hh
# Opt level: O2

void __thiscall
tchecker::graph::cover::
graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t>,unsigned_long,1ul>>,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t,tchecker::tck_reach::zg_covreach::node_hash_t,tchecker::tck_reach::zg_covreach::node_le_t>::node_sptr_hash_t,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t,tchecker::tck_reach::zg_covreach::node_hash_t,tchecker::tck_reach::zg_covreach::node_le_t>::node_sptr_le_t>
::
covered_nodes<std::back_insert_iterator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t>,unsigned_long,1ul>>>>>>
          (graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t>,unsigned_long,1ul>>,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t,tchecker::tck_reach::zg_covreach::node_hash_t,tchecker::tck_reach::zg_covreach::node_le_t>::node_sptr_hash_t,tchecker::graph::subsumption::graph_t<tchecker::tck_reach::zg_covreach::node_t,tchecker::tck_reach::zg_covreach::edge_t,tchecker::tck_reach::zg_covreach::node_hash_t,tchecker::tck_reach::zg_covreach::node_le_t>::node_sptr_le_t>
           *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
                 *n,
          back_insert_iterator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>_>
          *ins)

{
  bool bVar1;
  __normal_iterator<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_*,_std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>_>
  n1;
  __normal_iterator<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_*,_std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>_>
  __begin0;
  __normal_iterator<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_*,_std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>_>
  __end0;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_*,_std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_*,_std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>_>_>
  rVar2;
  
  rVar2 = collision_table_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t,_tchecker::tck_reach::zg_covreach::node_hash_t,_tchecker::tck_reach::zg_covreach::node_le_t>::node_sptr_hash_t>
          ::collision_range((collision_table_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t,_tchecker::tck_reach::zg_covreach::node_hash_t,_tchecker::tck_reach::zg_covreach::node_le_t>::node_sptr_hash_t>
                             *)this,n);
  for (n1 = rVar2._begin._M_current; n1._M_current != rVar2._end._M_current._M_current;
      n1._M_current = n1._M_current + 1) {
    if ((n1._M_current)->_t != n->_t) {
      bVar1 = subsumption::
              graph_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t,_tchecker::tck_reach::zg_covreach::node_hash_t,_tchecker::tck_reach::zg_covreach::node_le_t>
              ::node_sptr_le_t::operator()((node_sptr_le_t *)(this + 0x28),n1._M_current,n);
      if (bVar1) {
        std::
        back_insert_iterator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>_>
        ::operator=(ins,n1._M_current);
      }
    }
  }
  return;
}

Assistant:

void covered_nodes(NODE_SPTR const & n, INSERTER & ins) const
  {
    auto && range = _nodes.collision_range(n);
    for (NODE_SPTR const & node : range)
      if ((node != n) && _node_le(node, n))
        ins = node;
  }